

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtablewidget.cpp
# Opt level: O0

void __thiscall QTableModel::setItem(QTableModel *this,int row,int column,QTableWidgetItem *item)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  QTableModel *this_00;
  qsizetype qVar4;
  const_reference ppQVar5;
  QTableWidget *pQVar6;
  reference ppQVar7;
  iterator j;
  uint *puVar8;
  QTableWidgetItem *in_RCX;
  int in_EDX;
  uint in_ESI;
  QModelIndex *in_RDI;
  long in_FS_OFFSET;
  int destinationChild;
  int sortedRow;
  SortOrder order;
  QTableWidget *view;
  QTableWidgetItem *oldItem;
  int i;
  QModelIndex idx;
  iterator it;
  QList<QTableWidgetItem_*> colItems;
  int in_stack_fffffffffffffeb8;
  SortOrder in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  undefined4 in_stack_fffffffffffffec8;
  uint uVar9;
  undefined4 in_stack_fffffffffffffecc;
  QTableWidgetItem *pQVar10;
  int column_00;
  undefined4 in_stack_fffffffffffffef8;
  undefined4 in_stack_fffffffffffffefc;
  uint local_f8;
  undefined1 local_c0 [48];
  undefined1 *local_90;
  undefined1 *local_88;
  undefined1 *local_80;
  undefined1 local_78 [24];
  undefined1 local_60 [24];
  int local_48;
  int local_44;
  QTableWidgetItem **local_40;
  QTableWidgetItem **local_38;
  QTableWidgetItem **local_30;
  iterator local_28;
  QList<QTableWidgetItem_*> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  lVar3 = tableIndex((QTableModel *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                     in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8);
  iVar2 = (int)lVar3;
  if (-1 < iVar2) {
    this_00 = (QTableModel *)(long)iVar2;
    qVar4 = QList<QTableWidgetItem_*>::size((QList<QTableWidgetItem_*> *)(in_RDI + 0x18));
    if ((long)this_00 < qVar4) {
      ppQVar5 = QList<QTableWidgetItem_*>::at
                          ((QList<QTableWidgetItem_*> *)
                           CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                           CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
      pQVar10 = *ppQVar5;
      if (in_RCX != pQVar10) {
        if (pQVar10 != (QTableWidgetItem *)0x0) {
          pQVar10->view = (QTableWidget *)0x0;
        }
        ppQVar5 = QList<QTableWidgetItem_*>::at
                            ((QList<QTableWidgetItem_*> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        pQVar10 = *ppQVar5;
        if (pQVar10 != (QTableWidgetItem *)0x0) {
          (*pQVar10->_vptr_QTableWidgetItem[1])();
        }
        column_00 = (int)((ulong)pQVar10 >> 0x20);
        pQVar6 = QTableModel::view((QTableModel *)0x8d49b7);
        if (in_RCX != (QTableWidgetItem *)0x0) {
          in_RCX->d->id = iVar2;
        }
        ppQVar7 = QList<QTableWidgetItem_*>::operator[]
                            ((QList<QTableWidgetItem_*> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                             CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8));
        *ppQVar7 = in_RCX;
        if ((pQVar6 != (QTableWidget *)0x0) &&
           (bVar1 = QTableWidget::isSortingEnabled((QTableWidget *)0x8d4a0f), bVar1)) {
          QTableView::horizontalHeader
                    ((QTableView *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          iVar2 = QHeaderView::sortIndicatorSection
                            ((QHeaderView *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
          if (iVar2 == in_EDX) {
            QTableView::horizontalHeader
                      ((QTableView *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
            QHeaderView::sortIndicatorOrder
                      ((QHeaderView *)CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0))
            ;
            local_20.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
            local_20.d.ptr = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
            local_20.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
            columnItems(this_00,column_00);
            qVar4 = QList<QTableWidgetItem_*>::size(&local_20);
            if ((int)in_ESI < qVar4) {
              QList<QTableWidgetItem_*>::remove(&local_20,(char *)(long)(int)in_ESI);
            }
            if (in_RCX == (QTableWidgetItem *)0x0) {
              qVar4 = QList<QTableWidgetItem_*>::size(&local_20);
              local_f8 = (uint)qVar4;
            }
            else {
              local_28.i = (QTableWidgetItem **)&DAT_aaaaaaaaaaaaaaaa;
              QList<QTableWidgetItem_*>::iterator::iterator(&local_28);
              local_38 = (QTableWidgetItem **)
                         QList<QTableWidgetItem_*>::begin
                                   ((QList<QTableWidgetItem_*> *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
              local_40 = (QTableWidgetItem **)
                         QList<QTableWidgetItem_*>::end
                                   ((QList<QTableWidgetItem_*> *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
              local_30 = (QTableWidgetItem **)
                         sortedInsertionIterator
                                   ((iterator *)
                                    CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8),
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                                    in_stack_fffffffffffffebc,
                                    (QTableWidgetItem *)
                                    CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
              local_28 = (iterator)local_30;
              j = QList<QTableWidgetItem_*>::begin
                            ((QList<QTableWidgetItem_*> *)
                             CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
              qVar4 = QList<QTableWidgetItem_*>::iterator::operator-(&local_28,j);
              local_44 = (int)qVar4;
              local_48 = 0;
              puVar8 = (uint *)qMax<int>(&local_44,&local_48);
              local_f8 = *puVar8;
            }
            if (local_f8 == in_ESI) {
              iVar2 = 0;
            }
            else {
              if ((int)in_ESI < (int)local_f8) {
                local_f8 = local_f8 + 1;
              }
              QModelIndex::QModelIndex((QModelIndex *)0x8d4bf9);
              uVar9 = in_ESI;
              QModelIndex::QModelIndex((QModelIndex *)0x8d4c0e);
              (**(code **)(*(long *)in_RDI + 0x118))(in_RDI,local_60,uVar9,1,local_78,local_f8);
              iVar2 = 1;
            }
            QList<QTableWidgetItem_*>::~QList((QList<QTableWidgetItem_*> *)0x8d4c59);
            if (iVar2 != 0) goto LAB_008d4d21;
          }
        }
        local_90 = &DAT_aaaaaaaaaaaaaaaa;
        local_88 = &DAT_aaaaaaaaaaaaaaaa;
        local_80 = &DAT_aaaaaaaaaaaaaaaa;
        QModelIndex::QModelIndex((QModelIndex *)0x8d4cb4);
        QAbstractTableModel::index((int)&local_90,(int)in_RDI,(QModelIndex *)(ulong)in_ESI);
        memset(local_c0,0,0x18);
        QList<int>::QList((QList<int> *)0x8d4cf7);
        QAbstractItemModel::dataChanged
                  (in_RDI,(QModelIndex *)&local_90,(QList_conflict2 *)&local_90);
        QList<int>::~QList((QList<int> *)0x8d4d21);
      }
    }
  }
LAB_008d4d21:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTableModel::setItem(int row, int column, QTableWidgetItem *item)
{
    int i = tableIndex(row, column);
    if (i < 0 || i >= tableItems.size())
        return;
    QTableWidgetItem *oldItem = tableItems.at(i);
    if (item == oldItem)
        return;

    // remove old
    if (oldItem)
        oldItem->view = nullptr;
    delete tableItems.at(i);

    QTableWidget *view = this->view();

    // set new
    if (item)
        item->d->id = i;
    tableItems[i] = item;

    if (view && view->isSortingEnabled()
        && view->horizontalHeader()->sortIndicatorSection() == column) {
        // sorted insertion
        Qt::SortOrder order = view->horizontalHeader()->sortIndicatorOrder();
        QList<QTableWidgetItem *> colItems = columnItems(column);
        if (row < colItems.size())
            colItems.remove(row);
        int sortedRow;
        if (item == nullptr) {
            // move to after all non-0 (sortable) items
            sortedRow = colItems.size();
        } else {
            QList<QTableWidgetItem *>::iterator it;
            it = sortedInsertionIterator(colItems.begin(), colItems.end(), order, item);
            sortedRow = qMax((int)(it - colItems.begin()), 0);
        }
        if (sortedRow != row) {
            const int destinationChild = sortedRow > row ? sortedRow + 1 : sortedRow;
            moveRows(QModelIndex(), row, 1, QModelIndex(), destinationChild);
            return;
        }
    }
    QModelIndex idx = QAbstractTableModel::index(row, column);
    emit dataChanged(idx, idx);
}